

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

TupleMake * __thiscall
wasm::Builder::makeTupleMake<wasm::SmallVector<wasm::Expression*,1ul>>
          (Builder *this,SmallVector<wasm::Expression_*,_1UL> *operands)

{
  TupleMake *this_00;
  
  this_00 = MixedArena::alloc<wasm::TupleMake>(&this->wasm->allocator);
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
  set<wasm::SmallVector<wasm::Expression*,1ul>>
            ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)&this_00->operands
             ,operands);
  TupleMake::finalize(this_00);
  return this_00;
}

Assistant:

TupleMake* makeTupleMake(ListType&& operands) {
    auto* ret = wasm.allocator.alloc<TupleMake>();
    ret->operands.set(operands);
    ret->finalize();
    return ret;
  }